

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::IsWorthSpecializingToInt32DueToSrc(GlobOpt *this,Opnd *src,Value *val)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ValueInfo *this_00;
  GlobOptBlockData *this_01;
  RegOpnd *pRVar5;
  bool local_41;
  bool local_31;
  ValueInfo *valueInfo;
  Value *val_local;
  Opnd *src_local;
  GlobOpt *this_local;
  
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d24,"(src)","src");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (val == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d25,"(val)","val");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = ::Value::GetValueInfo(val);
  bVar3 = ValueType::IsLikelyInt(&this_00->super_ValueType);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d27,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = ValueType::IsInt(&this_00->super_ValueType);
  local_31 = true;
  if (!bVar3) {
    bVar3 = ValueInfo::HasIntConstantValue(this_00,true);
    local_31 = true;
    if (!bVar3) {
      bVar3 = IR::Opnd::GetIsDead(src);
      local_31 = true;
      if (bVar3) {
        bVar3 = IR::Opnd::IsRegOpnd(src);
        local_31 = true;
        if (bVar3) {
          this_01 = CurrentBlockData(this);
          pRVar5 = IR::Opnd::AsRegOpnd(src);
          bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(this_01,&pRVar5->m_sym->super_Sym);
          local_31 = true;
          if (!bVar3) {
            local_41 = false;
            if (this->currentBlock->loop != (Loop *)0x0) {
              pBVar1 = this->currentBlock->loop->landingPad;
              pRVar5 = IR::Opnd::AsRegOpnd(src);
              local_41 = GlobOptBlockData::IsLive(&pBVar1->globOptData,&pRVar5->m_sym->super_Sym);
            }
            local_31 = local_41;
          }
        }
      }
    }
  }
  return local_31;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32DueToSrc(IR::Opnd *const src, Value *const val)
{
    Assert(src);
    Assert(val);
    ValueInfo *valueInfo = val->GetValueInfo();
    Assert(valueInfo->IsLikelyInt());

    // If it is not known that the operand is definitely an int, the operand is not already type-specialized, and it's not live
    // in the loop landing pad (if we're in a loop), it's probably not worth type-specializing this instruction. The common case
    // where type-specializing this would be bad is where the operations are entirely on properties or array elements, where the
    // ratio of FromVars and ToVars to the number of actual operations is high, and the conversions would dominate the time
    // spent. On the other hand, if we're using a function formal parameter more than once, it would probably be worth
    // type-specializing it, hence the IsDead check on the operands.
    return
        valueInfo->IsInt() ||
        valueInfo->HasIntConstantValue(true) ||
        !src->GetIsDead() ||
        !src->IsRegOpnd() ||
        CurrentBlockData()->IsInt32TypeSpecialized(src->AsRegOpnd()->m_sym) ||
        (this->currentBlock->loop && this->currentBlock->loop->landingPad->globOptData.IsLive(src->AsRegOpnd()->m_sym));
}